

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_lxvw4x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 val;
  TCGv_i64 val_00;
  TCGv_i64 EA;
  TCGv_i64 val_01;
  TCGv_i64 ret;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    val = tcg_temp_new_i64(tcg_ctx);
    val_00 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx,0x20);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    if (ctx->le_mode == true) {
      val_01 = tcg_temp_new_i64(tcg_ctx);
      ret = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val_01,EA,(long)ctx->mem_idx,MO_64);
      tcg_gen_shri_i64_ppc64(tcg_ctx,ret,val_01,0x20);
      tcg_gen_deposit_i64_ppc64(tcg_ctx,val,ret,val_01,0x20,0x20);
      tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val_01,EA,(long)ctx->mem_idx,MO_64);
      tcg_gen_shri_i64_ppc64(tcg_ctx,ret,val_01,0x20);
      tcg_gen_deposit_i64_ppc64(tcg_ctx,val_00,ret,val_01,0x20,0x20);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val_01 + (long)tcg_ctx));
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    }
    else {
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val,EA,(long)ctx->mem_idx,MO_BEQ);
      tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val_00,EA,(long)ctx->mem_idx,MO_BEQ);
    }
    set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,val);
    set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5,val_00);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val_00 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_lxvw4x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);

    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);

    gen_addr_reg_index(ctx, EA);
    if (ctx->le_mode) {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, ctx->mem_idx, MO_LEQ);
        tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
        tcg_gen_deposit_i64(tcg_ctx, xth, t1, t0, 32, 32);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, ctx->mem_idx, MO_LEQ);
        tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
        tcg_gen_deposit_i64(tcg_ctx, xtl, t1, t0, 32, 32);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    } else {
        tcg_gen_qemu_ld_i64(tcg_ctx, xth, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, xtl, EA, ctx->mem_idx, MO_BEQ);
    }
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
}